

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void wtree_summary(wtree_object wt)

{
  int iVar1;
  int local_24;
  int t;
  int J;
  int p2;
  int k;
  int i;
  wtree_object wt_local;
  
  iVar1 = wt->J;
  wave_summary(wt->wave);
  printf("\n");
  printf("Wavelet Transform : %s \n",wt->method);
  printf("\n");
  printf("Signal Extension : %s \n",wt->ext);
  printf("\n");
  printf("Number of Decomposition Levels %d \n",(ulong)(uint)wt->J);
  printf("\n");
  printf("Length of Input Signal %d \n",(ulong)(uint)wt->siglength);
  printf("\n");
  printf("Length of WT Output Vector %d \n",(ulong)(uint)wt->outlength);
  printf("\n");
  printf("Wavelet Coefficients are contained in vector : %s \n","output");
  printf("\n");
  printf("Coefficients Access \n");
  local_24 = 0;
  t = 2;
  for (p2 = 0; p2 < iVar1; p2 = p2 + 1) {
    for (J = 0; J < t; J = J + 1) {
      printf("Node %d %d Access : output[%d] Length : %d \n",(ulong)(p2 + 1),(ulong)(uint)J,
             (ulong)(uint)wt->nodelength[local_24],(ulong)(uint)wt->length[iVar1 - p2]);
      local_24 = local_24 + 1;
    }
    t = t << 1;
  }
  printf("\n");
  return;
}

Assistant:

void wtree_summary(wtree_object wt) {
	int i,k,p2;
	int J,t;
	J = wt->J;
	wave_summary(wt->wave);
	printf("\n");
	printf("Wavelet Transform : %s \n", wt->method);
	printf("\n");
	printf("Signal Extension : %s \n", wt->ext);
	printf("\n");
	printf("Number of Decomposition Levels %d \n", wt->J);
	printf("\n");
	printf("Length of Input Signal %d \n", wt->siglength);
	printf("\n");
	printf("Length of WT Output Vector %d \n", wt->outlength);
	printf("\n");
	printf("Wavelet Coefficients are contained in vector : %s \n", "output");
	printf("\n");
	printf("Coefficients Access \n");
	t = 0;
	p2 = 2;
	for (i = 0; i < J; ++i) {
		for (k = 0; k < p2; ++k) {
			printf("Node %d %d Access : output[%d] Length : %d \n", i + 1, k, wt->nodelength[t], wt->length[J - i]);
			t++;
		}
		p2 *= 2;
	}
	printf("\n");

}